

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astFunctionApplicationNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  size_t argumentCount_00;
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t result;
  sysbvm_tuple_t argumentNode;
  size_t i;
  size_t applicationArgumentCount;
  sysbvm_stackFrameGCRootsRecord_t callFrameStackRecord;
  sysbvm_functionCallFrameStack_t callFrameStack;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_astFunctionApplicationNode_t **applicationNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  callFrameStack.gcRoots.applicationArguments[0xf] = 0;
  sysbvm_stackFrame_pushRecord
            ((sysbvm_stackFrameRecord_t *)(callFrameStack.gcRoots.applicationArguments + 0xf));
  memset(&callFrameStackRecord.roots,0,0xb0);
  memset(&applicationArgumentCount,0,0x20);
  callFrameStackRecord.previous._0_4_ = 0;
  callFrameStackRecord.type = 0x11;
  callFrameStackRecord._12_4_ = 0;
  callFrameStackRecord.rootCount = (size_t)&callFrameStack.argumentIndex;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&applicationArgumentCount);
  argumentCount_00 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x30));
  sVar1 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                    (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  sysbvm_functionCallFrameStack_begin
            (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,sVar1,
             argumentCount_00,0);
  for (argumentNode = 0; argumentNode < argumentCount_00; argumentNode = argumentNode + 1) {
    sVar1 = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x30),argumentNode);
    sVar1 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context,sVar1,arguments[1]);
    sysbvm_functionCallFrameStack_push
              ((sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,sVar1);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&applicationArgumentCount);
  sVar1 = sysbvm_functionCallFrameStack_finish
                    (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots);
  sysbvm_stackFrame_popRecord
            ((sysbvm_stackFrameRecord_t *)(callFrameStack.gcRoots.applicationArguments + 0xf));
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astFunctionApplicationNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astFunctionApplicationNode_t **applicationNode = (sysbvm_astFunctionApplicationNode_t**)node;

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*applicationNode)->super.sourcePosition);

    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    size_t applicationArgumentCount = sysbvm_array_getSize((*applicationNode)->arguments);
    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*applicationNode)->functionExpression, *environment), applicationArgumentCount, 0);

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        sysbvm_tuple_t argumentNode = sysbvm_array_at((*applicationNode)->arguments, i);
        sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, argumentNode, *environment));
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    sysbvm_tuple_t result = sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    return result;
}